

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::inBeforeToken(Tokenizer *this,char ch)

{
  bool bVar1;
  undefined7 in_register_00000031;
  
  if ((uint)CONCAT71(in_register_00000031,ch) < 0x26) {
    if ((0x100003e01U >> ((ulong)(byte)ch & 0x3f) & 1) != 0) {
      bVar1 = this->include_ignorable;
      this->before_token = (bool)(bVar1 ^ 1);
      this->in_token = bVar1;
      if (bVar1 == true) {
        this->state = st_in_space;
      }
      return;
    }
    if ((CONCAT71(in_register_00000031,ch) & 0xffffffff) == 0x25) {
      this->before_token = (bool)(this->include_ignorable ^ 1);
      this->in_token = this->include_ignorable;
      this->state = st_in_comment;
      return;
    }
  }
  this->before_token = false;
  this->in_token = true;
  inTop(this,ch);
  return;
}

Assistant:

bool
Tokenizer::isSpace(char ch)
{
    return (ch == '\0' || util::is_space(ch));
}